

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void leaveblock(FuncState *fs)

{
  int *piVar1;
  LexState *ls;
  BlockCnt *pBVar2;
  BlockCnt *pBVar3;
  Dyndata *pDVar4;
  LocVar *pLVar5;
  Dyndata *pDVar6;
  Labeldesc *pLVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  TString *name;
  byte bVar11;
  uint uVar12;
  int i;
  Vardesc *pVVar14;
  ulong uVar13;
  
  ls = fs->ls;
  pBVar2 = fs->bl;
  if ((pBVar2->previous != (BlockCnt *)0x0) && (pBVar2->upval != '\0')) {
    iVar9 = luaK_jump(fs);
    luaK_patchclose(fs,iVar9,(uint)pBVar2->nactvar);
    luaK_patchtohere(fs,iVar9);
  }
  if (pBVar2->isloop != '\0') {
    name = luaS_new(ls->L,"break");
    iVar9 = newlabelentry(ls,&ls->dyd->label,name,0,ls->fs->pc);
    findgotos(ls,(ls->dyd->label).arr + iVar9);
  }
  pBVar3 = pBVar2->previous;
  fs->bl = pBVar3;
  bVar8 = pBVar2->nactvar;
  bVar11 = fs->nactvar;
  uVar13 = (ulong)bVar11;
  pDVar4 = fs->ls->dyd;
  piVar1 = &(pDVar4->actvar).n;
  *piVar1 = *piVar1 + ((uint)bVar8 - (uint)bVar11);
  if (bVar8 < bVar11) {
    iVar9 = fs->pc;
    pLVar5 = fs->f->locvars;
    pVVar14 = (pDVar4->actvar).arr + (long)fs->firstlocal + uVar13;
    do {
      pVVar14 = pVVar14 + -1;
      pLVar5[pVVar14->idx].endpc = iVar9;
      uVar12 = (int)uVar13 - 1;
      uVar13 = (ulong)uVar12;
    } while (bVar8 <= uVar12 && uVar12 != bVar8);
    bVar11 = (byte)uVar12;
    fs->nactvar = bVar11;
  }
  fs->freereg = bVar11;
  pDVar6 = ls->dyd;
  (pDVar6->label).n = pBVar2->firstlabel;
  iVar9 = pBVar2->firstgoto;
  if (pBVar3 == (BlockCnt *)0x0) {
    if (iVar9 < (pDVar6->gt).n) {
      undefgoto(ls,(pDVar6->gt).arr + iVar9);
    }
  }
  else {
    for (; iVar9 < (pDVar4->gt).n; iVar9 = iVar9 + (uint)(iVar10 == 0)) {
      pLVar7 = (pDVar4->gt).arr;
      bVar8 = pBVar2->nactvar;
      if (bVar8 < pLVar7[iVar9].nactvar) {
        if (pBVar2->upval != '\0') {
          luaK_patchclose(fs,pLVar7[iVar9].pc,(uint)bVar8);
          bVar8 = pBVar2->nactvar;
        }
        pLVar7[iVar9].nactvar = bVar8;
      }
      iVar10 = findlabel(fs->ls,iVar9);
    }
  }
  return;
}

Assistant:

static void leaveblock(FuncState *fs) {
    BlockCnt *bl = fs->bl;
    LexState *ls = fs->ls;
    if (bl->previous && bl->upval) {
        /* create a 'jump to here' to close upvalues */
        int j = luaK_jump(fs);
        luaK_patchclose(fs, j, bl->nactvar);
        luaK_patchtohere(fs, j);
    }
    if (bl->isloop)
        breaklabel(ls);  /* close pending breaks */
    fs->bl = bl->previous;
    removevars(fs, bl->nactvar);
    lua_assert(bl->nactvar == fs->nactvar);
    fs->freereg = fs->nactvar;  /* free registers */
    ls->dyd->label.n = bl->firstlabel;  /* remove local labels */
    if (bl->previous)  /* inner block? */
        movegotosout(fs, bl);  /* update pending gotos to outer block */
    else if (bl->firstgoto < ls->dyd->gt.n)  /* pending gotos in outer block? */
        undefgoto(ls, &ls->dyd->gt.arr[bl->firstgoto]);  /* error */
}